

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-test.c++
# Opt level: O2

void __thiscall kj::anon_unknown_0::TestCase207::run(TestCase207 *this)

{
  Disposer *pDVar1;
  PromiseNode *pPVar2;
  TransformPromiseNodeBase *pTVar3;
  int iVar4;
  bool bVar5;
  Promise<void> promise;
  Own<kj::_::PromiseNode> local_e0;
  Own<kj::_::PromiseNode> local_d0;
  undefined1 local_c0 [16];
  PromiseNode *pPStack_b0;
  WaitScope waitScope;
  Own<kj::_::PromiseNode> intermediate;
  Own<kj::_::PromiseNode> local_88;
  Own<kj::_::PromiseNode> local_78;
  EventLoop loop;
  
  EventLoop::EventLoop(&loop);
  waitScope.busyPollInterval = 0xffffffff;
  waitScope.loop = &loop;
  EventLoop::enterScope(&loop);
  promise.super_PromiseBase.node.disposer = (Disposer *)0x0;
  promise.super_PromiseBase.node.ptr = (PromiseNode *)0x0;
  _::yield();
  pTVar3 = (TransformPromiseNodeBase *)operator_new(0x30);
  _::TransformPromiseNodeBase::TransformPromiseNodeBase
            (pTVar3,&local_d0,
             _::
             TransformPromiseNode<kj::_::Void,_kj::_::Void,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-test.c++:212:23),_kj::_::PropagateException>
             ::anon_class_8_1_70ebebfb_for_func::operator());
  (pTVar3->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_0041a828;
  pTVar3[1].super_PromiseNode._vptr_PromiseNode = (_func_int **)&promise;
  local_c0._0_8_ =
       &_::
        HeapDisposer<kj::_::TransformPromiseNode<kj::_::Void,kj::_::Void,kj::(anonymous_namespace)::TestCase207::run()::$_0,kj::_::PropagateException>>
        ::instance;
  intermediate.disposer =
       (Disposer *)
       &_::
        HeapDisposer<kj::_::TransformPromiseNode<kj::_::Void,kj::_::Void,kj::(anonymous_namespace)::TestCase207::run()::$_0,kj::_::PropagateException>>
        ::instance;
  local_c0._8_8_ = (Disposer *)0x0;
  local_e0.disposer =
       (Disposer *)
       &_::
        HeapDisposer<kj::_::TransformPromiseNode<kj::_::Void,kj::_::Void,kj::(anonymous_namespace)::TestCase207::run()::$_0,kj::_::PropagateException>>
        ::instance;
  intermediate.ptr = (PromiseNode *)0x0;
  local_e0.ptr = (PromiseNode *)pTVar3;
  Own<kj::_::PromiseNode>::dispose(&intermediate);
  Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)local_c0);
  Own<kj::_::PromiseNode>::dispose(&local_d0);
  Own<kj::_::PromiseNode>::operator=((Own<kj::_::PromiseNode> *)&promise,&local_e0);
  Own<kj::_::PromiseNode>::dispose(&local_e0);
  iVar4 = 1000;
  while (bVar5 = iVar4 != 0, iVar4 = iVar4 + -1, bVar5) {
    local_c0._8_8_ = promise.super_PromiseBase.node.disposer;
    pPStack_b0 = promise.super_PromiseBase.node.ptr;
    promise.super_PromiseBase.node.ptr = (PromiseNode *)0x0;
    _::yield();
    pTVar3 = (TransformPromiseNodeBase *)operator_new(0x40);
    _::TransformPromiseNodeBase::TransformPromiseNodeBase
              (pTVar3,&local_78,
               CaptureByMove<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-test.c++:226:44),_kj::Promise<void>_>
               ::operator()<>);
    pPVar2 = pPStack_b0;
    pPStack_b0 = (PromiseNode *)0x0;
    (pTVar3->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_0041a8b0;
    pTVar3[1].dependency.disposer = (Disposer *)local_c0._8_8_;
    pTVar3[1].dependency.ptr = pPVar2;
    intermediate.disposer =
         (Disposer *)
         &_::
          HeapDisposer<kj::_::TransformPromiseNode<kj::Promise<void>,kj::_::Void,kj::CaptureByMove<kj::(anonymous_namespace)::TestCase207::run()::$_1,kj::Promise<void>>,kj::_::PropagateException>>
          ::instance;
    intermediate.ptr = (PromiseNode *)pTVar3;
    _::maybeChain<void>(&local_e0,(Promise<void> *)&intermediate);
    pPVar2 = local_e0.ptr;
    pDVar1 = local_e0.disposer;
    local_d0.disposer = local_e0.disposer;
    local_e0.ptr = (PromiseNode *)0x0;
    Own<kj::_::PromiseNode>::dispose(&local_e0);
    local_88.disposer = pDVar1;
    local_88.ptr = pPVar2;
    local_d0.ptr = (PromiseNode *)0x0;
    Own<kj::_::PromiseNode>::dispose(&local_d0);
    Own<kj::_::PromiseNode>::dispose(&intermediate);
    Own<kj::_::PromiseNode>::dispose(&local_78);
    Own<kj::_::PromiseNode>::operator=((Own<kj::_::PromiseNode> *)&promise,&local_88);
    Own<kj::_::PromiseNode>::dispose(&local_88);
    Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)(local_c0 + 8));
  }
  Promise<void>::wait(&promise,&waitScope);
  Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)&promise);
  WaitScope::~WaitScope(&waitScope);
  EventLoop::~EventLoop(&loop);
  return;
}

Assistant:

TEST(Async, DeepChain2) {
  EventLoop loop;
  WaitScope waitScope(loop);

  Promise<void> promise = nullptr;
  promise = evalLater([&]() {
    auto trace = promise.trace();
    uint lines = 0;
    for (char c: trace) {
      lines += c == '\n';
    }

    // Chain nodes should have been collapsed such that instead of a chain of 1000 nodes, we have
    // 2-ish nodes.  We'll give a little room for implementation freedom.
    EXPECT_LT(lines, 5);
  });

  // Create a ridiculous chain of promises.
  for (uint i = 0; i < 1000; i++) {
    promise = evalLater(mvCapture(promise, [](Promise<void> promise) {
      return kj::mv(promise);
    }));
  }

  promise.wait(waitScope);
}